

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O1

void Extra_ThreshSortByChow(word *t,int nVars,int *pChow)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  word wVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  int iVar10;
  word *pwVar11;
  byte bVar12;
  int t_1;
  ulong uVar13;
  word *pwVar14;
  uint *pLimitU;
  ulong uVar15;
  word *pwVar16;
  ulong uVar17;
  
  uVar7 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar7 = 1;
  }
  if (1 < nVars) {
    do {
      bVar9 = false;
      uVar13 = 0;
      do {
        iVar10 = pChow[uVar13];
        uVar17 = uVar13 + 1;
        if (iVar10 < pChow[uVar13 + 1]) {
          pChow[uVar13] = pChow[uVar13 + 1];
          pChow[uVar17] = iVar10;
          bVar9 = true;
          if (uVar13 < 5) {
            if (0 < (int)uVar7) {
              uVar2 = s_PMasks[uVar13][0];
              uVar3 = s_PMasks[uVar13][1];
              uVar4 = s_PMasks[uVar13][2];
              uVar15 = 0;
              do {
                uVar5 = t[uVar15];
                bVar12 = (byte)(1 << ((byte)uVar13 & 0x1f));
                t[uVar15] = (uVar5 & uVar4) >> (bVar12 & 0x3f) |
                            (uVar5 & uVar3) << (bVar12 & 0x3f) | uVar5 & uVar2;
                uVar15 = uVar15 + 1;
              } while (uVar7 != uVar15);
LAB_00819731:
              bVar9 = true;
            }
          }
          else if (uVar13 == 5) {
            pwVar11 = t;
            if (0 < (int)uVar7) {
              do {
                puVar1 = (ulong *)((long)pwVar11 + 4);
                *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
                pwVar11 = pwVar11 + 2;
              } while (pwVar11 < t + (int)uVar7);
            }
          }
          else if (0 < (int)uVar7) {
            uVar8 = 1 << ((byte)uVar13 - 6 & 0x1f);
            if (uVar13 < 7) {
              uVar8 = 1;
            }
            iVar10 = uVar8 * 4;
            pwVar11 = t + uVar8 * 2;
            pwVar16 = t + uVar8;
            pwVar14 = t;
            do {
              if (0 < (int)uVar8) {
                uVar13 = 0;
                do {
                  wVar6 = pwVar16[uVar13];
                  pwVar16[uVar13] = pwVar11[uVar13];
                  pwVar11[uVar13] = wVar6;
                  uVar13 = uVar13 + 1;
                } while (uVar8 != uVar13);
              }
              pwVar14 = pwVar14 + iVar10;
              pwVar11 = pwVar11 + iVar10;
              pwVar16 = pwVar16 + iVar10;
            } while (pwVar14 < t + (int)uVar7);
            goto LAB_00819731;
          }
        }
        uVar13 = uVar17;
      } while (uVar17 != nVars - 1);
    } while ((bVar9) && (1 < nVars));
  }
  return;
}

Assistant:

void Extra_ThreshSortByChow(word * t, int nVars, int * pChow) {
    int i, nWords = Abc_TtWordNum(nVars);
    //sort the variables by Chow in ascending order
    while (1) {
        int fChange = 0;
        for (i = 0; i < nVars - 1; i++) {
            if (pChow[i] >= pChow[i + 1])
                continue;
            ABC_SWAP(int, pChow[i], pChow[i + 1]);
            Abc_TtSwapAdjacent(t, nWords, i);
            fChange = 1;
        }
        if (!fChange)
            return;
    }
}